

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typed_expression.cc
# Opt level: O0

int __thiscall
tchecker::typed_ite_expression_t::clone
          (typed_ite_expression_t *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  typed_expression_t *ptVar1;
  typed_ite_expression_t *this_00;
  undefined1 local_50 [8];
  shared_ptr<const_tchecker::typed_expression_t> else_value_clone;
  undefined1 local_30 [8];
  shared_ptr<const_tchecker::typed_expression_t> then_value_clone;
  shared_ptr<const_tchecker::typed_expression_t> condition_clone;
  typed_ite_expression_t *this_local;
  
  ptVar1 = condition(this);
  ptVar1 = (typed_expression_t *)(**(code **)(*(long *)ptVar1 + 0x28))();
  std::shared_ptr<tchecker::typed_expression_t_const>::shared_ptr<tchecker::typed_expression_t,void>
            ((shared_ptr<tchecker::typed_expression_t_const> *)
             &then_value_clone.
              super___shared_ptr<const_tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,ptVar1);
  ptVar1 = then_value(this);
  ptVar1 = (typed_expression_t *)(**(code **)(*(long *)ptVar1 + 0x28))();
  std::shared_ptr<tchecker::typed_expression_t_const>::shared_ptr<tchecker::typed_expression_t,void>
            ((shared_ptr<tchecker::typed_expression_t_const> *)local_30,ptVar1);
  ptVar1 = else_value(this);
  ptVar1 = (typed_expression_t *)(**(code **)(*(long *)ptVar1 + 0x28))();
  std::shared_ptr<tchecker::typed_expression_t_const>::shared_ptr<tchecker::typed_expression_t,void>
            ((shared_ptr<tchecker::typed_expression_t_const> *)local_50,ptVar1);
  this_00 = (typed_ite_expression_t *)operator_new(0x48);
  typed_ite_expression_t
            (this_00,(this->super_typed_expression_t)._type,
             (shared_ptr<const_tchecker::typed_expression_t> *)
             &then_value_clone.
              super___shared_ptr<const_tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(shared_ptr<const_tchecker::typed_expression_t> *)local_30,
             (shared_ptr<const_tchecker::typed_expression_t> *)local_50);
  std::shared_ptr<const_tchecker::typed_expression_t>::~shared_ptr
            ((shared_ptr<const_tchecker::typed_expression_t> *)local_50);
  std::shared_ptr<const_tchecker::typed_expression_t>::~shared_ptr
            ((shared_ptr<const_tchecker::typed_expression_t> *)local_30);
  std::shared_ptr<const_tchecker::typed_expression_t>::~shared_ptr
            ((shared_ptr<const_tchecker::typed_expression_t> *)
             &then_value_clone.
              super___shared_ptr<const_tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return (int)this_00;
}

Assistant:

tchecker::typed_ite_expression_t * typed_ite_expression_t::clone() const
{
  std::shared_ptr<tchecker::typed_expression_t const> condition_clone{condition().clone()};
  std::shared_ptr<tchecker::typed_expression_t const> then_value_clone{then_value().clone()};
  std::shared_ptr<tchecker::typed_expression_t const> else_value_clone{else_value().clone()};
  return new tchecker::typed_ite_expression_t(_type, condition_clone, then_value_clone, else_value_clone);
}